

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.c
# Opt level: O0

int quicly_loss_init_sentmap_iter
              (quicly_loss_t *loss,quicly_sentmap_iter_t *iter,int64_t now,uint32_t max_ack_delay,
              int is_closing)

{
  int iVar1;
  int64_t iVar2;
  long lVar3;
  quicly_sent_packet_t *pqVar4;
  undefined4 in_ECX;
  quicly_sentmap_t *in_RDX;
  long in_RDI;
  int in_R8D;
  bool bVar5;
  int ret;
  quicly_sent_packet_t *sent;
  int64_t retire_before;
  undefined4 in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  quicly_sentmap_t *map;
  
  quicly_sentmap_init_iter
            ((quicly_sentmap_t *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             (quicly_sentmap_iter_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
  ;
  map = in_RDX;
  iVar2 = quicly_loss_get_sentmap_expiration_time
                    ((quicly_loss_t *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac);
  lVar3 = (long)in_RDX - iVar2;
  while( true ) {
    pqVar4 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x14fef1);
    bVar5 = false;
    if (pqVar4->sent_at <= lVar3) {
      bVar5 = pqVar4->cc_bytes_in_flight == 0;
    }
    if ((!bVar5) || ((in_R8D == 0 && (*(ulong *)(in_RDI + 0x80) < 0x20)))) break;
    iVar1 = quicly_sentmap_update
                      (map,(quicly_sentmap_iter_t *)CONCAT44(in_ECX,in_R8D),
                       (quicly_sentmap_event_t)((ulong)lVar3 >> 0x20));
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int quicly_loss_init_sentmap_iter(quicly_loss_t *loss, quicly_sentmap_iter_t *iter, int64_t now, uint32_t max_ack_delay,
                                  int is_closing)
{
    quicly_sentmap_init_iter(&loss->sentmap, iter);

    int64_t retire_before = now - quicly_loss_get_sentmap_expiration_time(loss, max_ack_delay);

    /* Retire entries older than the time specified, unless the connection is alive and the number of packets in the sentmap is
     * below 32 packets. This exception (the threshold of 32) exists to be capable of recognizing excessively late-ACKs when under
     * heavy loss; in such case, 32 is more than enough, yet small enough that the memory footprint does not matter. */
    const quicly_sent_packet_t *sent;
    while ((sent = quicly_sentmap_get(iter))->sent_at <= retire_before && sent->cc_bytes_in_flight == 0) {
        int ret;
        if (!is_closing && loss->sentmap.num_packets < 32)
            break;
        if ((ret = quicly_sentmap_update(&loss->sentmap, iter, QUICLY_SENTMAP_EVENT_EXPIRED)) != 0)
            return ret;
    }
    return 0;
}